

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptionalUnlabeledTracker.h
# Opt level: O2

void TCLAP::OptionalUnlabeledTracker::check(bool req,string *argName)

{
  SpecificationException *this;
  allocator local_39;
  string local_38;
  
  if (alreadyOptionalRef()::ct != '\x01') {
    if (!req) {
      alreadyOptionalRef()::ct = '\x01';
    }
    return;
  }
  this = (SpecificationException *)__cxa_allocate_exception(0x68);
  std::__cxx11::string::string
            ((string *)&local_38,
             "You can\'t specify ANY Unlabeled Arg following an optional Unlabeled Arg",&local_39);
  SpecificationException::SpecificationException(this,&local_38,argName);
  __cxa_throw(this,&SpecificationException::typeinfo,ArgException::~ArgException);
}

Assistant:

inline void OptionalUnlabeledTracker::check( bool req, const std::string& argName )
{
    if ( OptionalUnlabeledTracker::alreadyOptional() )
        throw( SpecificationException(
	"You can't specify ANY Unlabeled Arg following an optional Unlabeled Arg",
	                argName ) );

    if ( !req )
        OptionalUnlabeledTracker::gotOptional();
}